

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

void __thiscall
embree::SceneGraph::PlyParser::parseHeader
          (PlyParser *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *header)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  runtime_error *prVar4;
  string version;
  string fmt;
  string tag;
  stringstream line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  do {
    p_Var1 = (header->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)header) {
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)(p_Var1 + 1),_S_out|_S_in);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(header,(header->
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)local_1b8,(string *)&local_1f8);
    iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
    bVar2 = true;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
      if (iVar3 == 0) {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)local_1b8,(string *)&local_218);
        iVar3 = std::__cxx11::string::compare((char *)&local_218);
        if (iVar3 == 0) {
          this->format = ASCII;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_218);
          if (iVar3 == 0) {
            this->format = BINARY_BIG_ENDIAN;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_218);
            if (iVar3 != 0) {
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_238,"invalid PLY file format: ",&local_218);
              std::runtime_error::runtime_error(prVar4,(string *)&local_238);
              __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            this->format = BINARY_LITTLE_ENDIAN;
          }
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)local_1b8,(string *)&local_238);
        iVar3 = std::__cxx11::string::compare((char *)&local_238);
        if (iVar3 != 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1d8,"invalid PLY file version: ",&local_238);
          std::runtime_error::runtime_error(prVar4,(string *)&local_1d8);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
        if (iVar3 == 0) {
          bVar2 = false;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
          if (iVar3 != 0) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_218,"unknown tag in PLY file: ",&local_1f8);
            std::runtime_error::runtime_error(prVar4,(string *)&local_218);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          parseElementDescr(this,(stringstream *)local_1b8,header);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void parseHeader(std::list<std::string>& header) 
      {
        while (!header.empty())
        {          
          std::stringstream line(header.front()); 
          header.pop_front();
          
          std::string tag; line >> tag;
          
          /* ignore comments */
          if (tag == "comment") {
          }
          
          /* parse format */
          else if (tag == "format")  
          {
            std::string fmt; line >> fmt;
            if (fmt == "ascii") format = ASCII;
            else if (fmt == "binary_big_endian") format = BINARY_BIG_ENDIAN;
            else if (fmt == "binary_little_endian") format = BINARY_LITTLE_ENDIAN;
            else throw std::runtime_error("invalid PLY file format: " + fmt);
            std::string  version; line >> version;
            if (version != "1.0") throw std::runtime_error("invalid PLY file version: " + version);
          }

          /* parse end of header tag */
          else if (tag == "end_header")
            break;
          
          /* parse elements */
          else if (tag == "element") parseElementDescr(line,header);
      
          /* report unknown tags */
          else throw std::runtime_error("unknown tag in PLY file: " + tag);
        }
      }